

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupDemiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  char *pcVar5;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *vSuper;
  int *piVar8;
  uint *__ptr;
  void *pvVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  Gia_Obj_t *pGVar15;
  int iVar16;
  long lVar17;
  size_t __nmemb;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  
  iVar7 = p->vCos->nSize;
  if (iVar7 - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x1088,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  if (iVar7 < 1) {
LAB_001f41ab:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar7 = *p->vCos->pArray;
  if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001f412f:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar1 = p->pObjs + iVar7;
  vSuper = (Vec_Int_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  piVar8 = (int *)malloc(400);
  vSuper->pArray = piVar8;
  Gia_ManDupWithConstrCollectAnd_rec
            (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vSuper,1);
  if (vSuper->nSize < 2) {
    __assert_fail("Vec_IntSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x108d,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  pcVar5 = "LOR";
  if ((*(uint *)pGVar1 >> 0x1d & 1) == 0) {
    pcVar5 = "LAND";
  }
  printf("The miter is %s-decomposable into %d parts.\n",pcVar5 + 1);
  Gia_ManLevelNum(p);
  uVar19 = vSuper->nSize;
  if (0 < (int)uVar19) {
    lVar17 = 0;
    do {
      if (vSuper->pArray[lVar17] < 0) goto LAB_001f416d;
      uVar19 = (uint)vSuper->pArray[lVar17] >> 1;
      pVVar12 = p->vLevels;
      Vec_IntFillExtra(pVVar12,uVar19 + 1,0);
      if (pVVar12->nSize <= (int)uVar19) goto LAB_001f41ab;
      if (p->nObjs <= (int)uVar19) goto LAB_001f412f;
      p->pObjs[uVar19].Value = pVVar12->pArray[uVar19];
      lVar17 = lVar17 + 1;
      uVar19 = vSuper->nSize;
    } while (lVar17 < (int)uVar19);
  }
  __ptr = (uint *)malloc(0x10);
  uVar18 = 8;
  if (6 < uVar19 - 1) {
    uVar18 = uVar19;
  }
  __ptr[1] = 0;
  *__ptr = uVar18;
  if (uVar18 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar18 << 3);
  }
  *(void **)(__ptr + 2) = pvVar9;
  if (0 < vSuper->nSize) {
    lVar17 = 0;
    do {
      uVar19 = vSuper->pArray[lVar17];
      if ((int)uVar19 < 0) {
LAB_001f416d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar19 >> 1)) goto LAB_001f412f;
      pGVar4 = p->pObjs;
      uVar18 = __ptr[1];
      uVar2 = *__ptr;
      if (uVar18 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar9 = malloc(0x80);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar21 = 0x10;
        }
        else {
          uVar21 = uVar2 * 2;
          if ((int)uVar21 <= (int)uVar2) goto LAB_001f3ce0;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar9 = malloc((ulong)uVar2 << 4);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr + 2),(ulong)uVar2 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar9;
        *__ptr = uVar21;
      }
LAB_001f3ce0:
      __ptr[1] = uVar18 + 1;
      *(ulong *)(*(long *)(__ptr + 2) + (long)(int)uVar18 * 8) =
           (ulong)(pGVar4 + (uVar19 >> 1)) ^ (ulong)(uVar19 & 1);
      lVar17 = lVar17 + 1;
    } while (lVar17 < vSuper->nSize);
  }
  uVar19 = __ptr[1];
  __nmemb = (size_t)(int)uVar19;
  if (1 < (long)__nmemb) {
    qsort(*(void **)(__ptr + 2),__nmemb,8,Gia_ManSortByValue);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_00->pName = pcVar11;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar5);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar5);
  }
  p_00->pSpec = pcVar11;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar12 = p->vCis;
  if (0 < pVVar12->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar12->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001f412f;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar6 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar6 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar15 = p_00->pObjs;
      if ((pGVar13 < pGVar15) || (pGVar15 + p_00->nObjs <= pGVar13)) goto LAB_001f414e;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar15) >> 2) * -0x55555555);
      pGVar15 = p_00->pObjs;
      if ((pGVar13 < pGVar15) || (pGVar15 + p_00->nObjs <= pGVar13)) goto LAB_001f414e;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar13 - (long)pGVar15) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar12 = p->vCis;
    } while (lVar17 < pVVar12->nSize);
  }
  if (0 < p->nObjs) {
    lVar17 = 8;
    lVar20 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar6 = *(ulong *)((long)pGVar4 + lVar17 + -8);
      if ((uVar6 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar6) {
        uVar18 = *(uint *)((long)pGVar4 +
                          lVar17 + (ulong)(uint)((int)(uVar6 & 0x1fffffff) << 2) * -3);
        if (((int)uVar18 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar17 + (ulong)((uint)(uVar6 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_001f418c;
        iVar7 = Gia_ManHashAnd(p_00,uVar18 ^ (uint)(uVar6 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar6 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar17) = iVar7;
      }
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar20 < p->nObjs);
  }
  if (0 < (int)uVar19) {
    lVar17 = *(long *)(__ptr + 2);
    sVar10 = 0;
    do {
      uVar6 = *(ulong *)(lVar17 + sVar10 * 8);
      pGVar15 = (Gia_Obj_t *)(uVar6 & 0xfffffffffffffffe);
      pGVar4 = p->pObjs;
      if ((pGVar15 < pGVar4) || (pGVar4 + p->nObjs <= pGVar15)) {
LAB_001f414e:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar19 = (int)((long)pGVar15 - (long)pGVar4 >> 2) * -0x55555555;
      if ((int)uVar19 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (p->nObjs <= (int)uVar19) goto LAB_001f412f;
      if ((int)pGVar4[uVar19 & 0x7fffffff].Value < 0) goto LAB_001f418c;
      Gia_ManAppendCo(p_00,(*(uint *)pGVar1 >> 0x1d ^ (uint)uVar6) & 1 ^
                           pGVar4[uVar19 & 0x7fffffff].Value);
      sVar10 = sVar10 + 1;
    } while (__nmemb != sVar10);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar16 = 0;
    do {
      iVar3 = p->vCos->nSize;
      uVar19 = (iVar3 - iVar7) + iVar16;
      if (((int)uVar19 < 0) || (iVar3 <= (int)uVar19)) goto LAB_001f41ab;
      iVar3 = p->vCos->pArray[uVar19];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001f412f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar3;
      uVar18 = (uint)*(undefined8 *)pGVar1;
      uVar19 = pGVar1[-(ulong)(uVar18 & 0x1fffffff)].Value;
      if ((int)uVar19 < 0) {
LAB_001f418c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar18 >> 0x1d & 1 ^ uVar19);
      iVar16 = iVar16 + 1;
      iVar7 = p->nRegs;
    } while (iVar16 < iVar7);
  }
  Gia_ManSetRegNum(p_00,iVar7);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (vSuper->pArray != (int *)0x0) {
    free(vSuper->pArray);
    vSuper->pArray = (int *)0x0;
  }
  free(vSuper);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManDupDemiter( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vSuper;
    Vec_Ptr_t * vSuperPtr;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjPo;
    int i, iLit;
    assert( Gia_ManPoNum(p) == 1 );
    // decompose
    pObjPo = Gia_ManPo( p, 0 );
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjFanin0(pObjPo), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // report the result
    printf( "The miter is %s-decomposable into %d parts.\n", Gia_ObjFaninC0(pObjPo) ? "OR":"AND", Vec_IntSize(vSuper) );
    // create levels
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Gia_ManObj(p, Abc_Lit2Var(iLit))->Value = Gia_ObjLevelId(p, Abc_Lit2Var(iLit));
    // create pointer array
    vSuperPtr = Vec_PtrAlloc( Vec_IntSize(vSuper) );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Vec_PtrPush( vSuperPtr, Gia_Lit2Obj(p, iLit) );
    Vec_PtrSort( vSuperPtr, (int (*)(void))Gia_ManSortByValue );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create the outputs
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuperPtr, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, Gia_Obj2Lit(p, pObj)) ^ Gia_ObjFaninC0(pObjPo) );
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    Vec_PtrFree( vSuperPtr );
    return pNew;
}